

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

Self * __thiscall
draco::PointAttributeVectorOutputIterator<unsigned_int>::operator=
          (PointAttributeVectorOutputIterator<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  __tuple_element_t<0UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *ppPVar4;
  size_t sVar5;
  __tuple_element_t<1UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *p_Var6;
  __tuple_element_t<3UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *p_Var7;
  GeometryAttribute *this_00;
  uint *puVar8;
  Self *in_RDI;
  uint32_t index_1;
  uint8_t *data_counter;
  uint32_t *data_source;
  uint32_t *num_components;
  uint32_t *data_size;
  uint32_t *offset;
  AttributeValueIndex avi;
  PointAttribute *attribute;
  AttributeTuple *att;
  int index;
  PointAttribute *in_stack_ffffffffffffff78;
  PointIndex point_index;
  uint local_6c;
  uint8_t *local_68;
  uint local_3c;
  uint local_38;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_34;
  PointAttribute *local_30;
  reference local_28;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::
            vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
            ::size(&in_RDI->attributes_);
    if (sVar3 <= uVar2) {
      return in_RDI;
    }
    local_28 = std::
               vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ::operator[](&in_RDI->attributes_,(long)local_1c);
    point_index.value_ = (uint)uVar2;
    ppPVar4 = std::
              get<0ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                        ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                          *)0x1c99ae);
    local_30 = *ppPVar4;
    local_38 = (in_RDI->point_id_).value_;
    local_34.value_ = (uint)PointAttribute::mapped_index(in_stack_ffffffffffffff78,point_index);
    sVar5 = PointAttribute::size(local_30);
    local_3c = (uint)sVar5;
    bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator>=
                      (&local_34,&local_3c);
    if (bVar1) break;
    p_Var6 = std::
             get<1ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                       ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         *)0x1c9a16);
    p_Var7 = std::
             get<3ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                       ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                         *)0x1c9a25);
    this_00 = (GeometryAttribute *)
              std::
              get<4ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                        ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                          *)0x1c9a34);
    puVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1c9a43);
    puVar8 = puVar8 + *p_Var6;
    if (*p_Var7 < 4) {
      local_68 = in_RDI->data_;
      for (local_6c = 0; local_6c < *(uint *)&this_00->buffer_; local_6c = local_6c + 1) {
        memcpy(local_68,puVar8 + local_6c,(ulong)*p_Var7);
        local_68 = local_68 + *p_Var7;
      }
      puVar8 = (uint *)in_RDI->data_;
    }
    GeometryAttribute::SetAttributeValue
              (this_00,(AttributeValueIndex)(uint)((ulong)p_Var7 >> 0x20),puVar8);
    local_1c = local_1c + 1;
  }
  return in_RDI;
}

Assistant:

const Self &operator=(const std::vector<CoeffT> &val) {
    for (auto index = 0; index < attributes_.size(); index++) {
      AttributeTuple &att = attributes_[index];
      PointAttribute *attribute = std::get<0>(att);
      const AttributeValueIndex avi = attribute->mapped_index(point_id_);
      if (avi >= static_cast<uint32_t>(attribute->size())) {
        return *this;
      }
      const uint32_t &offset = std::get<1>(att);
      const uint32_t &data_size = std::get<3>(att);
      const uint32_t &num_components = std::get<4>(att);
      const uint32_t *data_source = val.data() + offset;
      if (data_size < 4) {  // handle uint16_t, uint8_t
        // selectively copy data bytes
        uint8_t *data_counter = data_;
        for (uint32_t index = 0; index < num_components;
             index += 1, data_counter += data_size) {
          std::memcpy(data_counter, data_source + index, data_size);
        }
        // redirect to copied data
        data_source = reinterpret_cast<uint32_t *>(data_);
      }
      attribute->SetAttributeValue(avi, data_source);
    }
    return *this;
  }